

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrchrp(const_bstring b,int c,int pos)

{
  void *pvVar1;
  uchar *p;
  int pos_local;
  int c_local;
  const_bstring b_local;
  
  if ((((b == (const_bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen <= pos)) || (pos < 0)) {
    b_local._4_4_ = -1;
  }
  else {
    pvVar1 = memchr(b->data + pos,c & 0xff,(long)(b->slen - pos));
    if (pvVar1 == (void *)0x0) {
      b_local._4_4_ = -1;
    }
    else {
      b_local._4_4_ = (int)pvVar1 - (int)b->data;
    }
  }
  return b_local._4_4_;
}

Assistant:

int bstrchrp (const_bstring b, int c, int pos) {
unsigned char * p;

	if (b == NULL || b->data == NULL || b->slen <= pos || pos < 0)
		return BSTR_ERR;
	p = (unsigned char *) bstr__memchr ((b->data + pos), (unsigned char) c,
		                                (b->slen - pos));
	if (p) return (int) (p - b->data);
	return BSTR_ERR;
}